

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

_Bool panel_should_modify(term_conflict2 *t,wchar_t wy,wchar_t wx)

{
  int iVar1;
  _Bool local_31;
  int local_30;
  wchar_t screen_wid;
  wchar_t screen_hgt;
  wchar_t dungeon_wid;
  wchar_t dungeon_hgt;
  wchar_t wx_local;
  wchar_t wy_local;
  term_conflict2 *t_local;
  
  if (t == (term_conflict2 *)angband_term[0]) {
    iVar1 = ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode]) /
            (int)(uint)tile_height;
    local_30 = ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
  }
  else {
    iVar1 = t->hgt / (int)(uint)tile_height;
    local_30 = t->wid / (int)(uint)tile_width;
  }
  dungeon_hgt = wy;
  if (cave->height - iVar1 < wy) {
    dungeon_hgt = cave->height - iVar1;
  }
  if (dungeon_hgt < L'\0') {
    dungeon_hgt = L'\0';
  }
  dungeon_wid = wx;
  if (cave->width - local_30 < wx) {
    dungeon_wid = cave->width - local_30;
  }
  if (dungeon_wid < L'\0') {
    dungeon_wid = L'\0';
  }
  local_31 = true;
  if (t->offset_y == dungeon_hgt) {
    local_31 = t->offset_x != dungeon_wid;
  }
  return local_31;
}

Assistant:

bool panel_should_modify(term *t, int wy, int wx)
{
	int dungeon_hgt = cave->height;
	int dungeon_wid = cave->width;
	int screen_hgt = (t == angband_term[0]) ?
		SCREEN_HGT : t->hgt / tile_height;
	int screen_wid = (t == angband_term[0]) ?
		SCREEN_WID : t->wid / tile_width;

	/* Verify wy, adjust if needed */
	if (wy > dungeon_hgt - screen_hgt) wy = dungeon_hgt - screen_hgt;
	if (wy < 0) wy = 0;

	/* Verify wx, adjust if needed */
	if (wx > dungeon_wid - screen_wid) wx = dungeon_wid - screen_wid;
	if (wx < 0) wx = 0;

	/* Needs changes? */
	return ((t->offset_y != wy) || (t->offset_x != wx));
}